

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switchlevels.c
# Opt level: O0

int read_all(uchar *buf,size_t size)

{
  int iVar1;
  size_t sVar2;
  ulong in_RSI;
  long in_RDI;
  size_t n_read;
  size_t total_read;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    if (in_RSI <= local_20) {
      return 0;
    }
    sVar2 = fread((void *)(in_RDI + local_20),1,in_RSI - local_20,_stdin);
    iVar1 = ferror(_stdin);
    if (iVar1 != 0) break;
    if (sVar2 == 0) {
      fprintf(_stderr,"Premature EOF\n");
      return 1;
    }
    local_20 = sVar2 + local_20;
  }
  perror("fread\n");
  return 1;
}

Assistant:

static int read_all(unsigned char *buf, size_t size) {
    size_t total_read = 0;
    while (total_read < size) {
        size_t n_read = fread(buf + total_read, 1, size - total_read, stdin);
        if (ferror(stdin)) {
            perror("fread\n");
            return 1;
        }
        if (n_read == 0) {
            fprintf(stderr, "Premature EOF\n");
            return 1;
        }
        total_read += n_read;
    }
    return 0;
}